

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
          (ValueMap<std::vector<double,_std::allocator<double>_>,_int> *this)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  long *local_58 [2];
  long local_48 [2];
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> local_38;
  
  if ((this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_38.first = 0;
    local_38.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::_Select1st<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>>
    ::_M_insert_unique<std::pair<int_const,std::vector<double,std::allocator<double>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::_Select1st<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>>
                *)&this->map_,&local_38);
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + (this->name_)._M_string_length);
    std::__cxx11::string::append((char *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (local_38.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_38.first = 0;
  pmVar2 = std::
           map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::at(&this->map_,&local_38.first);
  return pmVar2;
}

Assistant:

Array& operator()() & {
    if (map_.empty())
      SetValueNodeName(
            map_.insert({ 0,
                           CreateArray<Array, Param>(prm_) }).
            first->second,
            name_ + "()");
    else
      assert(IsSingleKey());
    return map_.at(0);
  }